

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::F_formatter<spdlog::details::null_scoped_padder>::format
          (F_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  duration duration;
  ulong uVar8;
  byte abStack_2a [5];
  undefined2 local_25;
  char local_23 [3];
  char *local_20;
  
  uVar8 = (msg->time).__d.__r % 1000000000;
  lVar2 = 0x3f;
  if ((uVar8 | 1) != 0) {
    for (; (uVar8 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  uVar3 = (uint)(byte)::fmt::v9::detail::do_count_digits(unsigned_long)::bsr2log10[lVar2] -
          (uint)(uVar8 < *(ulong *)(::fmt::v9::detail::do_count_digits(unsigned_long)::
                                    zero_or_powers_of_10 +
                                   (ulong)(byte)::fmt::v9::detail::do_count_digits(unsigned_long)::
                                                bsr2log10[lVar2] * 8));
  if (uVar3 < 9) {
    iVar5 = 9 - uVar3;
    do {
      sVar4 = (dest->super_buffer<char>).size_;
      uVar6 = sVar4 + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar6) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar4 = (dest->super_buffer<char>).size_;
        uVar6 = sVar4 + 1;
      }
      (dest->super_buffer<char>).size_ = uVar6;
      (dest->super_buffer<char>).ptr_[sVar4] = '0';
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  pcVar7 = local_23;
  uVar6 = uVar8;
  if (99 < uVar8) {
    do {
      uVar8 = uVar6 / 100;
      *(undefined2 *)(pcVar7 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar6 % 100) * 2);
      pcVar7 = pcVar7 + -2;
      bVar1 = 9999 < uVar6;
      uVar6 = uVar8;
    } while (bVar1);
  }
  if (uVar8 < 10) {
    pcVar7[-1] = (byte)uVar8 | 0x30;
    local_20 = pcVar7 + -1;
  }
  else {
    *(undefined2 *)(pcVar7 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + uVar8 * 2);
    local_20 = pcVar7 + -2;
  }
  ::fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_20,local_23);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto ns = fmt_helper::time_fraction<std::chrono::nanoseconds>(msg.time);
        const size_t field_size = 9;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad9(static_cast<size_t>(ns.count()), dest);
    }